

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncOutput(xmlOutputBufferPtr output,int init)

{
  xmlBufPtr buf;
  xmlBufPtr buf_00;
  xmlCharEncodingHandlerPtr pxVar1;
  xmlCharEncodingOutputFunc p_Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  xmlChar *pxVar7;
  size_t sVar8;
  xmlChar *pxVar9;
  int iVar10;
  ulong len_00;
  int c_out;
  int c_in;
  int len;
  xmlChar charref [20];
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  uchar local_48 [24];
  
  uVar5 = 0xffffffff;
  if ((((output != (xmlOutputBufferPtr)0x0) && (output->encoder != (xmlCharEncodingHandlerPtr)0x0))
      && (buf = output->buffer, buf != (xmlBufPtr)0x0)) &&
     (buf_00 = output->conv, buf_00 != (xmlBufPtr)0x0)) {
    sVar6 = xmlBufAvail(buf_00);
    if (init == 0) {
      iVar10 = 0;
      local_4c = 0;
      do {
        sVar8 = xmlBufUse(buf);
        if (0xffff < sVar8) {
          sVar8 = 0x10000;
        }
        len_00 = (ulong)(uint)((int)sVar8 * 4);
        if (sVar6 <= len_00) {
          iVar4 = xmlBufGrow(buf_00,len_00);
          if (iVar4 < 0) {
            uVar5 = 0xfffffffc;
            goto LAB_0012c2e3;
          }
          sVar6 = xmlBufAvail(buf_00);
        }
        if (0x3ffff < sVar6) {
          sVar6 = 0x40000;
        }
        local_58 = (uint)sVar6;
        pxVar1 = output->encoder;
        local_54 = (int)sVar8;
        pxVar7 = xmlBufEnd(buf_00);
        pxVar9 = xmlBufContent(buf);
        p_Var2 = pxVar1->output;
        if (p_Var2 == (xmlCharEncodingOutputFunc)0x0) {
          local_58 = 0;
          local_54 = 0;
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = (*p_Var2)(pxVar7,(int *)&local_58,pxVar9,&local_54);
          uVar5 = (int)uVar5 >> 0x1f & uVar5;
        }
        xmlBufShrink(buf,(long)local_54);
        xmlBufAddLen(buf_00,(long)(int)local_58);
        iVar10 = iVar10 + local_58;
        if (uVar5 == 0xfffffffe) {
          sVar6 = xmlBufUse(buf);
          local_50 = (int)sVar6;
          pxVar7 = xmlBufContent(buf);
          iVar4 = xmlGetUTF8Char(pxVar7,&local_50);
          if (iVar4 < 1) {
            uVar5 = 0xfffffffe;
            bVar3 = false;
          }
          else {
            iVar4 = xmlSerializeDecCharRef((char *)local_48,iVar4);
            xmlBufGrow(buf_00,(long)(iVar4 * 4));
            sVar6 = xmlBufAvail(buf_00);
            local_58 = (uint)sVar6;
            pxVar1 = output->encoder;
            local_54 = iVar4;
            pxVar7 = xmlBufEnd(buf_00);
            p_Var2 = pxVar1->output;
            if (p_Var2 == (xmlCharEncodingOutputFunc)0x0) {
              local_58 = 0;
              local_54 = 0;
              uVar5 = 0xffffffff;
            }
            else {
              uVar5 = (*p_Var2)(pxVar7,(int *)&local_58,local_48,&local_54);
              uVar5 = (int)uVar5 >> 0x1f & uVar5;
            }
            bVar3 = false;
            if (((int)uVar5 < 0) || (local_54 != iVar4)) {
              uVar5 = 0xffffffff;
            }
            else {
              xmlBufShrink(buf,(long)local_50);
              xmlBufAddLen(buf_00,(long)(int)local_58);
              iVar10 = iVar10 + local_58;
              bVar3 = true;
            }
          }
          if (!bVar3) goto LAB_0012c2e3;
        }
        else if (uVar5 != 0xfffffffd) {
LAB_0012c2e3:
          if ((0 < iVar10 || uVar5 == 0) && (uVar5 != 0xfffffffc)) {
            return iVar10;
          }
          if (output->error != 0) {
            return uVar5;
          }
          iVar10 = 1;
          if (uVar5 + 4 < 5) {
            iVar10 = (&DAT_001cd7c0)[uVar5 + 4];
          }
          output->error = iVar10;
          return uVar5;
        }
        sVar6 = xmlBufAvail(buf_00);
      } while (local_4c == 0);
    }
    local_54 = 0;
    local_58 = (uint)sVar6;
    pxVar1 = output->encoder;
    pxVar7 = xmlBufEnd(buf_00);
    p_Var2 = pxVar1->output;
    if (p_Var2 == (xmlCharEncodingOutputFunc)0x0) {
      local_58 = 0;
      local_54 = 0;
    }
    else {
      (*p_Var2)(pxVar7,(int *)&local_58,(uchar *)0x0,&local_54);
    }
    xmlBufAddLen(buf_00,(long)(int)local_58);
    uVar5 = local_58;
  }
  return uVar5;
}

Assistant:

int
xmlCharEncOutput(xmlOutputBufferPtr output, int init)
{
    int ret;
    size_t written;
    int writtentot = 0;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((output == NULL) || (output->encoder == NULL) ||
        (output->buffer == NULL) || (output->conv == NULL))
        return(XML_ENC_ERR_INTERNAL);
    out = output->conv;
    in = output->buffer;

retry:

    written = xmlBufAvail(out);

    /*
     * First specific handling of the initialization call
     */
    if (init) {
        c_in = 0;
        c_out = written;
        /* TODO: Check return value. */
        xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                          NULL, &c_in);
        xmlBufAddLen(out, c_out);
        return(c_out);
    }

    /*
     * Conversion itself.
     */
    toconv = xmlBufUse(in);
    if (toconv > 64 * 1024)
        toconv = 64 * 1024;
    if (toconv * 4 >= written) {
        if (xmlBufGrow(out, toconv * 4) < 0) {
            ret = XML_ENC_ERR_MEMORY;
            goto error;
        }
        written = xmlBufAvail(out);
    }
    if (written > 256 * 1024)
        written = 256 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                            xmlBufContent(in), &c_in);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    writtentot += c_out;

    if (ret == XML_ENC_ERR_SPACE)
        goto retry;

    /*
     * Attempt to handle error cases
     */
    if (ret == XML_ENC_ERR_INPUT) {
        xmlChar charref[20];
        int len = xmlBufUse(in);
        xmlChar *content = xmlBufContent(in);
        int cur, charrefLen;

        cur = xmlGetUTF8Char(content, &len);
        if (cur <= 0)
            goto error;

        /*
         * Removes the UTF8 sequence, and replace it by a charref
         * and continue the transcoding phase, hoping the error
         * did not mangle the encoder state.
         */
        charrefLen = xmlSerializeDecCharRef((char *) charref, cur);
        xmlBufGrow(out, charrefLen * 4);
        c_out = xmlBufAvail(out);
        c_in = charrefLen;
        ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                                charref, &c_in);
        if ((ret < 0) || (c_in != charrefLen)) {
            ret = XML_ENC_ERR_INTERNAL;
            goto error;
        }

        xmlBufShrink(in, len);
        xmlBufAddLen(out, c_out);
        writtentot += c_out;
        goto retry;
    }

error:
    if (((writtentot <= 0) && (ret != 0)) ||
        (ret == XML_ENC_ERR_MEMORY)) {
        if (output->error == 0)
            output->error = xmlEncConvertError(ret);
        return(ret);
    }

    return(writtentot);
}